

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

Mat __thiscall Mat::operator=(Mat *this,Mat *rhs)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  double *pdVar4;
  int *in_RDX;
  double *extraout_RDX;
  Mat MVar5;
  int local_28;
  int i;
  int nEl;
  Mat *rhs_local;
  Mat *this_local;
  
  if (rhs->v_ != (double *)0x0) {
    operator_delete(rhs->v_,8);
  }
  rhs->n_rows_ = *in_RDX;
  rhs->n_cols_ = in_RDX[1];
  iVar2 = rhs->n_rows_ * rhs->n_cols_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pdVar4 = (double *)operator_new__(uVar3);
  rhs->v_ = pdVar4;
  for (local_28 = 0; local_28 < iVar2; local_28 = local_28 + 1) {
    rhs->v_[local_28] = *(double *)(*(long *)(in_RDX + 2) + (long)local_28 * 8);
  }
  Mat(this,rhs);
  MVar5.v_ = extraout_RDX;
  MVar5._0_8_ = this;
  return MVar5;
}

Assistant:

Mat Mat::operator=(const Mat& rhs)
{
	delete v_;	
	n_rows_ = rhs.n_rows_;
	n_cols_=rhs.n_cols_;
	int nEl = n_rows_*n_cols_;
	v_ = new double [nEl];
	for (int i=0; i<nEl; i++)
		v_[i]=rhs.v_[i];
	return *this;
}